

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

deUint32 __thiscall tcu::astc::anon_unknown_0::Block128::getBits(Block128 *this,int low,int high)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  
  if (high - low == -1) {
    return 0;
  }
  iVar3 = low + 0x3f;
  if (-1 < low) {
    iVar3 = low;
  }
  iVar1 = high;
  if (high < 0) {
    iVar1 = high + 0x3f;
  }
  bVar2 = (byte)high;
  if (iVar3 >> 6 == iVar1 >> 6) {
    return (deUint32)
           ((this->m_words[iVar3 >> 6] & (2L << (bVar2 & 0x3f)) - 1U) >> ((byte)low & 0x3f));
  }
  return (uint)(this->m_words[iVar3 >> 6] >> ((byte)low & 0x3f)) |
         (uint)(((2L << (bVar2 & 0x3f)) + 0xffffffffU & this->m_words[iVar1 >> 6]) <<
               ((char)(high - low) - bVar2 & 0x3f));
}

Assistant:

deUint32 getBits (int low, int high) const
	{
		DE_ASSERT(de::inBounds(low, 0, 128));
		DE_ASSERT(de::inBounds(high, 0, 128));
		DE_ASSERT(de::inRange(high-low+1, 0, 32));

		if (high-low+1 == 0)
			return 0;

		const int word0Ndx = low / WORD_BITS;
		const int word1Ndx = high / WORD_BITS;

		// \note "foo << bar << 1" done instead of "foo << (bar+1)" to avoid overflow, i.e. shift amount being too big.

		if (word0Ndx == word1Ndx)
			return (deUint32)((m_words[word0Ndx] & ((((Word)1 << high%WORD_BITS << 1) - 1))) >> ((Word)low % WORD_BITS));
		else
		{
			DE_ASSERT(word1Ndx == word0Ndx + 1);

			return (deUint32)(m_words[word0Ndx] >> (low%WORD_BITS)) |
				   (deUint32)((m_words[word1Ndx] & (((Word)1 << high%WORD_BITS << 1) - 1)) << (high-low - high%WORD_BITS));
		}
	}